

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.h
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexSeparableFilter::PtexSeparableFilter
          (PtexSeparableFilter *this,PtexTexture *tx,Options *opts)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 *in_RDX;
  _func_int **in_RSI;
  PtexFilter *in_RDI;
  
  PtexFilter::PtexFilter(in_RDI);
  in_RDI->_vptr_PtexFilter = (_func_int **)&PTR__PtexSeparableFilter_0014cd10;
  in_RDI[1]._vptr_PtexFilter = in_RSI;
  *(undefined4 *)&in_RDI[4]._vptr_PtexFilter = in_RDX[4];
  uVar3 = in_RDX[1];
  uVar1 = in_RDX[2];
  uVar2 = in_RDX[3];
  *(undefined4 *)&in_RDI[2]._vptr_PtexFilter = *in_RDX;
  *(undefined4 *)((long)&in_RDI[2]._vptr_PtexFilter + 4) = uVar3;
  *(undefined4 *)&in_RDI[3]._vptr_PtexFilter = uVar1;
  *(undefined4 *)((long)&in_RDI[3]._vptr_PtexFilter + 4) = uVar2;
  in_RDI[5]._vptr_PtexFilter = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[6]._vptr_PtexFilter = 0;
  *(undefined4 *)((long)&in_RDI[6]._vptr_PtexFilter + 4) = 0;
  *(undefined4 *)&in_RDI[7]._vptr_PtexFilter = 0;
  uVar3 = (**(code **)(*in_RDI[1]._vptr_PtexFilter + 0x58))();
  *(undefined4 *)((long)&in_RDI[7]._vptr_PtexFilter + 4) = uVar3;
  uVar3 = (**(code **)(*in_RSI + 0x30))();
  *(undefined4 *)&in_RDI[8]._vptr_PtexFilter = uVar3;
  uVar3 = (**(code **)(*in_RSI + 0x38))();
  *(undefined4 *)((long)&in_RDI[8]._vptr_PtexFilter + 4) = uVar3;
  uVar3 = (**(code **)(*in_RSI + 0x40))();
  *(undefined4 *)&in_RDI[9]._vptr_PtexFilter = uVar3;
  uVar3 = (**(code **)(*in_RSI + 0x48))();
  *(undefined4 *)((long)&in_RDI[9]._vptr_PtexFilter + 4) = uVar3;
  if (*(int *)&in_RDI[2]._vptr_PtexFilter < 0x10) {
    *(undefined1 *)&in_RDI[4]._vptr_PtexFilter = 0;
  }
  return;
}

Assistant:

PtexSeparableFilter(PtexTexture* tx, const PtexFilter::Options& opts ) :
        _tx(tx), _options(opts), _result(0), _weight(0),
        _firstChanOffset(0), _nchan(0), _ntxchan(_tx->numChannels()),
        _dt(tx->dataType()), _uMode(tx->uBorderMode()), _vMode(tx->vBorderMode()),
        _efm(tx->edgeFilterMode())
    {
        // if caller was compiled with older version of struct, set default for new opts
        if (_options.__structSize < (char*)&_options.noedgeblend - (char*)&_options) {
            _options.noedgeblend = 0;
        }
    }